

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O0

void __thiscall
VPLGrammar::Parser::UnaryOperatorNode::BuildProgram
          (UnaryOperatorNode *this,Scope *scope,ostream *out)

{
  int iVar1;
  const_reference this_00;
  pointer pAVar2;
  ostream *out_local;
  Scope *scope_local;
  UnaryOperatorNode *this_local;
  
  this_00 = std::
            vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
            ::operator[](&(this->super_ASTNodeBasic).children_,0);
  pAVar2 = std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ::operator->(this_00);
  iVar1 = (*pAVar2->_vptr_ASTNodeBasic[2])();
  if (iVar1 == 0x30) {
    std::operator<<(out,"    neg\n");
  }
  else if (iVar1 == 0x3b) {
    std::operator<<(out,"    not\n");
  }
  else if (iVar1 == 0x3c) {
    std::operator<<(out,"    push -1\n");
    std::operator<<(out,"    xor\n");
  }
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                switch (children_[0]->GetType()) {
                    case kMinusType:
                        out << "    neg\n";
                        break;
                    case kNotType:
                        out << "    not\n";
                        break;
                    case kBitwiseNotType:
                        out << "    push -1\n";
                        out << "    xor\n";
                        break;
                }
            }